

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lratchecker.cpp
# Opt level: O0

bool __thiscall
CaDiCaL::LratChecker::check_resolution
          (LratChecker *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *proof_chain)

{
  bool bVar1;
  LratCheckerClause **ppLVar2;
  char *pcVar3;
  LratChecker *in_RSI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  bool ok;
  int64_t lit_3;
  int *lit_2;
  iterator __end1_1;
  iterator __begin1_1;
  vector<int,_std::allocator<int>_> *__range1_1;
  int lit_1;
  int *i_1;
  unsigned_long *id;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> p;
  int lit;
  int *i;
  LratCheckerClause *c;
  char *b;
  iterator __end1;
  iterator __begin1;
  vector<signed_char,_std::allocator<signed_char>_> *__range1;
  undefined4 in_stack_ffffffffffffff28;
  byte in_stack_ffffffffffffff2c;
  byte in_stack_ffffffffffffff2d;
  byte in_stack_ffffffffffffff2e;
  byte bVar4;
  undefined1 in_stack_ffffffffffffff2f;
  LratChecker *this_00;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  LratChecker *in_stack_ffffffffffffff50;
  long lVar5;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_98;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_90;
  unsigned_long *local_88;
  int local_7c;
  int *local_78;
  reference local_70;
  unsigned_long *local_68;
  unsigned_long *local_60;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_58;
  int local_4c;
  int *local_48;
  LratCheckerClause *local_40;
  reference local_38;
  char *local_30;
  __normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_> local_28
  ;
  pointer *local_20;
  
  this_00 = in_RSI;
  bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty(in_RDI);
  if ((!bVar1) &&
     (((ulong)in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start & 1) == 0)) {
    local_20 = &in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish;
    local_28._M_current =
         (char *)std::vector<signed_char,_std::allocator<signed_char>_>::begin
                           ((vector<signed_char,_std::allocator<signed_char>_> *)
                            CONCAT17(in_stack_ffffffffffffff2f,
                                     CONCAT16(in_stack_ffffffffffffff2e,
                                              CONCAT15(in_stack_ffffffffffffff2d,
                                                       CONCAT14(in_stack_ffffffffffffff2c,
                                                                in_stack_ffffffffffffff28)))));
    local_30 = (char *)std::vector<signed_char,_std::allocator<signed_char>_>::end
                                 ((vector<signed_char,_std::allocator<signed_char>_> *)
                                  CONCAT17(in_stack_ffffffffffffff2f,
                                           CONCAT16(in_stack_ffffffffffffff2e,
                                                    CONCAT15(in_stack_ffffffffffffff2d,
                                                             CONCAT14(in_stack_ffffffffffffff2c,
                                                                      in_stack_ffffffffffffff28)))))
    ;
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
                               *)in_RSI,
                              (__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
                               *)CONCAT17(in_stack_ffffffffffffff2f,
                                          CONCAT16(in_stack_ffffffffffffff2e,
                                                   CONCAT15(in_stack_ffffffffffffff2d,
                                                            CONCAT14(in_stack_ffffffffffffff2c,
                                                                     in_stack_ffffffffffffff28))))),
          bVar1) {
      local_38 = __gnu_cxx::
                 __normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
                 ::operator*(&local_28);
      *local_38 = '\0';
      __gnu_cxx::
      __normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>::
      operator++(&local_28);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RSI);
    ppLVar2 = find(in_stack_ffffffffffffff50,
                   CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
    local_40 = *ppLVar2;
    for (local_48 = local_40->literals; local_48 < local_40->literals + local_40->size;
        local_48 = local_48 + 1) {
      local_4c = *local_48;
      pcVar3 = checked_lit(in_RSI,CONCAT13(in_stack_ffffffffffffff2f,
                                           CONCAT12(in_stack_ffffffffffffff2e,
                                                    CONCAT11(in_stack_ffffffffffffff2d,
                                                             in_stack_ffffffffffffff2c))));
      *pcVar3 = '\x01';
    }
    local_60 = (unsigned_long *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          CONCAT17(in_stack_ffffffffffffff2f,
                                   CONCAT16(in_stack_ffffffffffffff2e,
                                            CONCAT15(in_stack_ffffffffffffff2d,
                                                     CONCAT14(in_stack_ffffffffffffff2c,
                                                              in_stack_ffffffffffffff28)))));
    local_58 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator-((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)this_00,(difference_type)in_RSI);
    while( true ) {
      local_68 = (unsigned_long *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            CONCAT17(in_stack_ffffffffffffff2f,
                                     CONCAT16(in_stack_ffffffffffffff2e,
                                              CONCAT15(in_stack_ffffffffffffff2d,
                                                       CONCAT14(in_stack_ffffffffffffff2c,
                                                                in_stack_ffffffffffffff28)))));
      bVar1 = __gnu_cxx::operator>=
                        ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)in_RSI,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)CONCAT17(in_stack_ffffffffffffff2f,
                                     CONCAT16(in_stack_ffffffffffffff2e,
                                              CONCAT15(in_stack_ffffffffffffff2d,
                                                       CONCAT14(in_stack_ffffffffffffff2c,
                                                                in_stack_ffffffffffffff28)))));
      if (!bVar1) break;
      local_70 = __gnu_cxx::
                 __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(&local_58);
      ppLVar2 = find(in_stack_ffffffffffffff50,
                     CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
      local_40 = *ppLVar2;
      for (local_78 = local_40->literals; local_78 < local_40->literals + local_40->size;
          local_78 = local_78 + 1) {
        local_7c = *local_78;
        pcVar3 = checked_lit(in_RSI,CONCAT13(in_stack_ffffffffffffff2f,
                                             CONCAT12(in_stack_ffffffffffffff2e,
                                                      CONCAT11(in_stack_ffffffffffffff2d,
                                                               in_stack_ffffffffffffff2c))));
        if (*pcVar3 == '\0') {
          pcVar3 = checked_lit(in_RSI,CONCAT13(in_stack_ffffffffffffff2f,
                                               CONCAT12(in_stack_ffffffffffffff2e,
                                                        CONCAT11(in_stack_ffffffffffffff2d,
                                                                 in_stack_ffffffffffffff2c))));
          *pcVar3 = '\x01';
        }
        else {
          pcVar3 = checked_lit(in_RSI,CONCAT13(in_stack_ffffffffffffff2f,
                                               CONCAT12(in_stack_ffffffffffffff2e,
                                                        CONCAT11(in_stack_ffffffffffffff2d,
                                                                 in_stack_ffffffffffffff2c))));
          *pcVar3 = '\0';
        }
      }
      local_88 = (unsigned_long *)
                 __gnu_cxx::
                 __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator--((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)this_00,(int)((ulong)in_RSI >> 0x20));
    }
    local_90 = in_RDI + 10;
    local_98._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)
                           CONCAT17(in_stack_ffffffffffffff2f,
                                    CONCAT16(in_stack_ffffffffffffff2e,
                                             CONCAT15(in_stack_ffffffffffffff2d,
                                                      CONCAT14(in_stack_ffffffffffffff2c,
                                                               in_stack_ffffffffffffff28)))));
    std::vector<int,_std::allocator<int>_>::end
              ((vector<int,_std::allocator<int>_> *)
               CONCAT17(in_stack_ffffffffffffff2f,
                        CONCAT16(in_stack_ffffffffffffff2e,
                                 CONCAT15(in_stack_ffffffffffffff2d,
                                          CONCAT14(in_stack_ffffffffffffff2c,
                                                   in_stack_ffffffffffffff28)))));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              in_RSI,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                      *)CONCAT17(in_stack_ffffffffffffff2f,
                                                 CONCAT16(in_stack_ffffffffffffff2e,
                                                          CONCAT15(in_stack_ffffffffffffff2d,
                                                                   CONCAT14(
                                                  in_stack_ffffffffffffff2c,
                                                  in_stack_ffffffffffffff28))))), bVar1) {
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                (&local_98);
      pcVar3 = checked_lit(in_RSI,CONCAT13(in_stack_ffffffffffffff2f,
                                           CONCAT12(in_stack_ffffffffffffff2e,
                                                    CONCAT11(in_stack_ffffffffffffff2d,
                                                             in_stack_ffffffffffffff2c))));
      if (*pcVar3 != '\0') {
        return false;
      }
      pcVar3 = checked_lit(in_RSI,CONCAT13(in_stack_ffffffffffffff2f,
                                           CONCAT12(in_stack_ffffffffffffff2e,
                                                    CONCAT11(in_stack_ffffffffffffff2d,
                                                             in_stack_ffffffffffffff2c))));
      if (*pcVar3 == '\0') {
        pcVar3 = checked_lit(in_RSI,CONCAT13(in_stack_ffffffffffffff2f,
                                             CONCAT12(in_stack_ffffffffffffff2e,
                                                      CONCAT11(in_stack_ffffffffffffff2d,
                                                               in_stack_ffffffffffffff2c))));
        *pcVar3 = '\x01';
      }
      pcVar3 = checked_lit(in_RSI,CONCAT13(in_stack_ffffffffffffff2f,
                                           CONCAT12(in_stack_ffffffffffffff2e,
                                                    CONCAT11(in_stack_ffffffffffffff2d,
                                                             in_stack_ffffffffffffff2c))));
      *pcVar3 = '\x01';
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_98);
    }
    for (lVar5 = 1;
        lVar5 < (long)(in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                      _M_impl.super__Vector_impl_data._M_end_of_storage; lVar5 = lVar5 + 1) {
      pcVar3 = checked_lit(in_RSI,CONCAT13(in_stack_ffffffffffffff2f,
                                           CONCAT12(in_stack_ffffffffffffff2e,
                                                    CONCAT11(in_stack_ffffffffffffff2d,
                                                             in_stack_ffffffffffffff2c))));
      in_stack_ffffffffffffff2f = false;
      if (*pcVar3 != '\0') {
        pcVar3 = checked_lit(in_RSI,(uint)CONCAT12(in_stack_ffffffffffffff2e,
                                                   CONCAT11(in_stack_ffffffffffffff2d,
                                                            in_stack_ffffffffffffff2c)));
        in_stack_ffffffffffffff2f = *pcVar3 != '\0';
      }
      bVar4 = 1;
      in_stack_ffffffffffffff2e = bVar4;
      if ((bool)in_stack_ffffffffffffff2f == false) {
        pcVar3 = checked_lit(in_RSI,(uint)CONCAT12(1,CONCAT11(in_stack_ffffffffffffff2d,
                                                              in_stack_ffffffffffffff2c)));
        in_stack_ffffffffffffff2d = 0;
        in_stack_ffffffffffffff2e = in_stack_ffffffffffffff2d;
        if (*pcVar3 == '\0') {
          pcVar3 = checked_lit(in_RSI,CONCAT13(in_stack_ffffffffffffff2f,
                                               CONCAT12(bVar4,(ushort)in_stack_ffffffffffffff2c)));
          in_stack_ffffffffffffff2d = *pcVar3 != '\0' ^ 0xff;
          in_stack_ffffffffffffff2e = in_stack_ffffffffffffff2d;
        }
      }
      if ((in_stack_ffffffffffffff2e & 1) == 0) {
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool LratChecker::check_resolution (vector<uint64_t> proof_chain) {
  if (proof_chain.empty ()) { // ignore these case TODO chain.size == 1?
    LOG ("LRAT CHECKER resolution check skipped clause is tautological");
    return true;
  }
  if (strict_lrat) { // ignore this case
    LOG ("LRAT CHECKER resolution check skipped because "
         "opts.externallrat=true");
    return true;
  }
  LOG (imported_clause, "LRAT CHECKER checking clause with resolution");
  for (auto &b : checked_lits)
    b = false; // clearing checking bits
  LratCheckerClause *c = *find (proof_chain.back ());
  assert (c);
  for (int *i = c->literals; i < c->literals + c->size; i++) {
    int lit = *i;
    checked_lit (lit) = true;
    assert (!checked_lit (-lit));
  }
  for (auto p = proof_chain.end () - 2; p >= proof_chain.begin (); p--) {
    auto &id = *p;
    c = *find (id);
    assert (c); // since this is checked in check already
    for (int *i = c->literals; i < c->literals + c->size; i++) {
      int lit = *i;
      if (!checked_lit (-lit))
        checked_lit (lit) = true;
      else
        checked_lit (-lit) = false;
    }
  }
  for (const auto &lit : imported_clause) {
    if (checked_lit (-lit)) {
      LOG ("LRAT CHECKER resolution failed, resolved literal %d in learned "
           "clause",
           lit);
      return false;
    }
    if (!checked_lit (lit)) {
      // learned clause is subsumed by resolvents
      checked_lit (lit) = true;
    }
    checked_lit (-lit) = true;
  }
  for (int64_t lit = 1; lit < size_vars; lit++) {
    bool ok = checked_lit (lit) && checked_lit (-lit);
    ok = ok || (!checked_lit (lit) && !checked_lit (-lit));
    if (!ok) {
      LOG ("LRAT CHECKER resolution failed, learned clause does not match "
           "on "
           "variable %" PRId64,
           lit);
      return false;
    }
  }

  return true;
}